

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror_s.c
# Opt level: O3

int main(void)

{
  errno_t eVar1;
  char s [14];
  undefined5 local_16;
  undefined1 uStack_11;
  undefined2 uStack_10;
  undefined5 uStack_e;
  undefined1 uStack_9;
  
  eVar1 = strerror_s((char *)&local_16,0xe,0x84);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x3d,"strerror_s( s, 14, _PDCLIB_ERRNO_MAX ) == 0");
  }
  if (CONCAT17(uStack_9,CONCAT52(uStack_e,uStack_10)) != 0x726f727265206e ||
      CONCAT26(uStack_10,CONCAT15(uStack_11,local_16)) != 0x206e776f6e6b6e75) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x3e,"strcmp( s, \"unknown error\" ) == 0");
  }
  eVar1 = strerror_s((char *)&local_16,0xd,0x84);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x3f,"strerror_s( s, 13, _PDCLIB_ERRNO_MAX ) == 0");
  }
  if (CONCAT53(uStack_e,CONCAT21(uStack_10,uStack_11)) != 0x2e2e2e65206e77 ||
      CONCAT26(uStack_10,CONCAT15(uStack_11,local_16)) != 0x206e776f6e6b6e75) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x40,"strcmp( s, \"unknown e...\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[14];
    TESTCASE( strerror_s( s, 14, _PDCLIB_ERRNO_MAX ) == 0 );
    TESTCASE( strcmp( s, "unknown error" ) == 0 );
    TESTCASE( strerror_s( s, 13, _PDCLIB_ERRNO_MAX ) == 0 );
    TESTCASE( strcmp( s, "unknown e..." ) == 0 );
#endif
    return TEST_RESULTS;
}